

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void insertion_sort_suite::sort_1234_predicate(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator second_begin;
  iterator second_end;
  undefined1 local_2c [8];
  array<int,_4UL> expect;
  array<int,_4UL> storage;
  
  stack0xffffffffffffffe8 = 0x160000000b;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect._M_elems + 3));
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect._M_elems + 3));
  vista::insertion_sort<int*,std::greater<int>>(pvVar1,pvVar2);
  local_2c._0_4_ = 0x2c;
  local_2c._4_4_ = 0x21;
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0xb;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect._M_elems + 3));
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect._M_elems + 3));
  second_begin = std::array<int,_4UL>::begin((array<int,_4UL> *)local_2c);
  second_end = std::array<int,_4UL>::end((array<int,_4UL> *)local_2c);
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x5a1,"void insertion_sort_suite::sort_1234_predicate()",pvVar1,pvVar2,second_begin,
             second_end);
  return;
}

Assistant:

void sort_1234_predicate()
{
    std::array<int, 4> storage = { 11, 22, 33, 44 };
    insertion_sort(storage.begin(), storage.end(), vista::greater<int>{});
    {
        std::array<int, 4> expect = { 44, 33, 22, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}